

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_remapper.h
# Opt level: O0

void __thiscall xray_re::xr_remapper::xr_remapper(xr_remapper *this,uint32_t min,uint32_t max)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint32_t *puVar3;
  uint32_t max_local;
  uint32_t min_local;
  xr_remapper *this_local;
  
  this->m_min = min;
  this->m_max = max;
  auVar1 = ZEXT416((max - min) + 1) * ZEXT816(4);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  puVar3 = (uint32_t *)operator_new__(uVar2);
  this->m_mapping = puVar3;
  std::uninitialized_fill_n<unsigned_int*,unsigned_int,unsigned_int>
            (this->m_mapping,(max - min) + 1,&BAD_IDX);
  return;
}

Assistant:

inline xr_remapper::xr_remapper(uint32_t min, uint32_t max): m_min(min), m_max(max)
{
	m_mapping = new uint32_t[max - min + 1];
#if defined(_MSC_VER) && _MSC_VER >= 1400 && _MSC_VER < 1600
	stdext::unchecked_uninitialized_fill_n(m_mapping, max - min + 1, BAD_IDX);
#else
	std::uninitialized_fill_n(m_mapping, max - min + 1, BAD_IDX);
#endif
}